

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void rhash_sha256_process_block(uint *hash,uint *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint local_108;
  uint local_104;
  uint local_fc;
  uint local_e0;
  uint local_dc;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c0;
  
  uVar1 = *hash;
  uVar2 = hash[1];
  uVar3 = hash[2];
  uVar4 = hash[4];
  uVar5 = hash[5];
  uVar6 = hash[6];
  uVar17 = *block;
  uVar21 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar6 ^ uVar5) & uVar4 ^ uVar6) + hash[7] +
          ((uVar4 << 7 | uVar4 >> 0x19) ^
          (uVar4 << 0x15 | uVar4 >> 0xb) ^ (uVar4 << 0x1a | uVar4 >> 6));
  uVar18 = hash[3] + iVar8 + uVar21 + 0x428a2f98;
  uVar7 = ((uVar2 ^ uVar1) & uVar3 ^ uVar2 & uVar1) +
          ((uVar1 << 10 | uVar1 >> 0x16) ^
          (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
          iVar8 + uVar21 + 0x428a2f98;
  uVar9 = (uVar18 * 0x80 | uVar18 >> 0x19) ^
          (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6);
  uVar17 = block[1];
  uVar14 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar5 ^ uVar4) & uVar18 ^ uVar5) + uVar14 + uVar6;
  uVar10 = ((uVar7 ^ uVar1) & uVar2 ^ uVar7 & uVar1) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) +
           iVar8 + uVar9 + 0x71374491;
  uVar22 = uVar3 + iVar8 + uVar9 + 0x71374491;
  uVar9 = (uVar22 * 0x80 | uVar22 >> 0x19) ^
          (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6);
  uVar17 = block[2];
  uVar19 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar18 ^ uVar4) & uVar22 ^ uVar4) + uVar19 + uVar5;
  uVar12 = ((uVar10 ^ uVar7) & uVar1 ^ uVar10 & uVar7) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) +
           iVar8 + uVar9 + -0x4a3f0431;
  uVar24 = uVar2 + iVar8 + uVar9 + 0xb5c0fbcf;
  uVar15 = (uVar24 * 0x80 | uVar24 >> 0x19) ^
           (uVar24 * 0x200000 | uVar24 >> 0xb) ^ (uVar24 * 0x4000000 | uVar24 >> 6);
  uVar17 = block[3];
  uVar9 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar22 ^ uVar18) & uVar24 ^ uVar18) + uVar9 + uVar4;
  uVar13 = uVar1 + iVar8 + uVar15 + 0xe9b5dba5;
  uVar16 = ((uVar12 ^ uVar10) & uVar7 ^ uVar12 & uVar10) +
           ((uVar12 * 0x400 | uVar12 >> 0x16) ^
           (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) +
           iVar8 + uVar15 + -0x164a245b;
  uVar17 = block[4];
  local_c0 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = uVar18 + local_c0 + ((uVar24 ^ uVar22) & uVar13 ^ uVar22) +
          ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) + 0x3956c25b;
  uVar7 = uVar7 + iVar8;
  uVar20 = ((uVar16 ^ uVar12) & uVar10 ^ uVar16 & uVar12) +
           ((uVar16 * 0x400 | uVar16 >> 0x16) ^
           (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar8;
  uVar17 = block[5];
  local_cc = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) +
          uVar22 + local_cc + ((uVar13 ^ uVar24) & uVar7 ^ uVar24) + 0x59f111f1;
  uVar10 = uVar10 + iVar8;
  uVar23 = ((uVar20 ^ uVar16) & uVar12 ^ uVar20 & uVar16) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar8;
  uVar17 = block[6];
  local_dc = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar24 + local_dc + ((uVar7 ^ uVar13) & uVar10 ^ uVar13) + -0x6dc07d5c;
  uVar12 = uVar12 + iVar8;
  uVar15 = ((uVar23 ^ uVar20) & uVar16 ^ uVar23 & uVar20) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
  uVar17 = block[7];
  local_d4 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_d4 + ((uVar10 ^ uVar7) & uVar12 ^ uVar7) + -0x54e3a12b;
  uVar16 = uVar16 + iVar8;
  uVar13 = ((uVar15 ^ uVar23) & uVar20 ^ uVar15 & uVar23) +
           ((uVar15 * 0x400 | uVar15 >> 0x16) ^
           (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar8;
  uVar17 = block[8];
  local_d0 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = uVar7 + local_d0 + ((uVar12 ^ uVar10) & uVar16 ^ uVar10) +
          ((uVar16 * 0x80 | uVar16 >> 0x19) ^
          (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) + -0x27f85568;
  uVar20 = uVar20 + iVar8;
  uVar22 = ((uVar13 ^ uVar15) & uVar23 ^ uVar13 & uVar15) +
           ((uVar13 * 0x400 | uVar13 >> 0x16) ^
           (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar8;
  uVar17 = block[9];
  uVar18 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = uVar10 + uVar18 + ((uVar16 ^ uVar12) & uVar20 ^ uVar12) +
          ((uVar20 * 0x80 | uVar20 >> 0x19) ^
          (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) + 0x12835b01;
  uVar23 = uVar23 + iVar8;
  uVar25 = ((uVar22 ^ uVar13) & uVar15 ^ uVar22 & uVar13) +
           ((uVar22 * 0x400 | uVar22 >> 0x16) ^
           (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
  uVar17 = block[10];
  local_e0 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
          (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
          uVar12 + local_e0 + ((uVar20 ^ uVar16) & uVar23 ^ uVar16) + 0x243185be;
  uVar15 = uVar15 + iVar8;
  uVar12 = ((uVar25 ^ uVar22) & uVar13 ^ uVar25 & uVar22) +
           ((uVar25 * 0x400 | uVar25 >> 0x16) ^
           (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar8;
  uVar17 = block[0xb];
  local_c8 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar15 * 0x80 | uVar15 >> 0x19) ^
          (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6)) +
          uVar16 + local_c8 + ((uVar23 ^ uVar20) & uVar15 ^ uVar20) + 0x550c7dc3;
  uVar13 = uVar13 + iVar8;
  uVar24 = ((uVar12 ^ uVar25) & uVar22 ^ uVar12 & uVar25) +
           ((uVar12 * 0x400 | uVar12 >> 0x16) ^
           (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar8;
  uVar17 = block[0xc];
  local_104 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar13 * 0x80 | uVar13 >> 0x19) ^
          (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6)) +
          uVar20 + local_104 + ((uVar15 ^ uVar23) & uVar13 ^ uVar23) + 0x72be5d74;
  uVar22 = uVar22 + iVar8;
  uVar20 = ((uVar24 ^ uVar12) & uVar25 ^ uVar24 & uVar12) +
           ((uVar24 * 0x400 | uVar24 >> 0x16) ^
           (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar8;
  uVar17 = block[0xd];
  local_108 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar22 * 0x80 | uVar22 >> 0x19) ^
          (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) +
          uVar23 + local_108 + ((uVar13 ^ uVar15) & uVar22 ^ uVar15) + -0x7f214e02;
  uVar25 = uVar25 + iVar8;
  uVar16 = ((uVar20 ^ uVar24) & uVar12 ^ uVar20 & uVar24) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar8;
  uVar17 = block[0xe];
  uVar7 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
          (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
          uVar15 + uVar7 + ((uVar22 ^ uVar13) & uVar25 ^ uVar13) + -0x6423f959;
  uVar12 = uVar12 + iVar8;
  uVar10 = ((uVar16 ^ uVar20) & uVar24 ^ uVar16 & uVar20) +
           ((uVar16 * 0x400 | uVar16 >> 0x16) ^
           (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar8;
  uVar17 = block[0xf];
  local_fc = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
  iVar8 = ((uVar12 * 0x80 | uVar12 >> 0x19) ^
          (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6)) +
          uVar13 + local_fc + ((uVar25 ^ uVar22) & uVar12 ^ uVar22) + -0x3e640e8c;
  uVar24 = uVar24 + iVar8;
  uVar17 = ((uVar10 ^ uVar16) & uVar20 ^ uVar10 & uVar16) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
  lVar11 = 0;
  do {
    uVar21 = uVar21 + uVar18 +
             (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7)) +
             (uVar7 >> 10 ^ (uVar7 << 0xd | uVar7 >> 0x13) ^ (uVar7 << 0xf | uVar7 >> 0x11));
    iVar8 = ((uVar12 ^ uVar25) & uVar24 ^ uVar25) + uVar22 +
            ((uVar24 << 7 | uVar24 >> 0x19) ^
            (uVar24 << 0x15 | uVar24 >> 0xb) ^ (uVar24 << 0x1a | uVar24 >> 6)) + uVar21 +
            rhash_k256[lVar11 + 0x10];
    uVar20 = uVar20 + iVar8;
    uVar13 = ((uVar17 ^ uVar10) & uVar16 ^ uVar17 & uVar10) +
             ((uVar17 << 10 | uVar17 >> 0x16) ^
             (uVar17 << 0x13 | uVar17 >> 0xd) ^ (uVar17 << 0x1e | uVar17 >> 2)) + iVar8;
    uVar14 = uVar14 + local_e0 +
             (uVar19 >> 3 ^ (uVar19 << 0xe | uVar19 >> 0x12) ^ (uVar19 << 0x19 | uVar19 >> 7)) +
             (local_fc >> 10 ^
             (local_fc << 0xd | local_fc >> 0x13) ^ (local_fc << 0xf | local_fc >> 0x11));
    iVar8 = uVar25 + uVar14 + rhash_k256[lVar11 + 0x11] + ((uVar24 ^ uVar12) & uVar20 ^ uVar12) +
            ((uVar20 * 0x80 | uVar20 >> 0x19) ^
            (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    uVar16 = uVar16 + iVar8;
    uVar15 = ((uVar13 ^ uVar17) & uVar10 ^ uVar13 & uVar17) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar8;
    uVar19 = uVar19 + local_c8 +
             (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7)) +
             (uVar21 >> 10 ^ (uVar21 * 0x2000 | uVar21 >> 0x13) ^ (uVar21 * 0x8000 | uVar21 >> 0x11)
             );
    iVar8 = uVar12 + uVar19 + rhash_k256[lVar11 + 0x12] + ((uVar20 ^ uVar24) & uVar16 ^ uVar24) +
            ((uVar16 * 0x80 | uVar16 >> 0x19) ^
            (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6));
    uVar10 = uVar10 + iVar8;
    uVar12 = ((uVar15 ^ uVar13) & uVar17 ^ uVar15 & uVar13) +
             ((uVar15 * 0x400 | uVar15 >> 0x16) ^
             (uVar15 * 0x80000 | uVar15 >> 0xd) ^ (uVar15 * 0x40000000 | uVar15 >> 2)) + iVar8;
    uVar9 = uVar9 + local_104 +
            (local_c0 >> 3 ^
            (local_c0 << 0xe | local_c0 >> 0x12) ^ (local_c0 << 0x19 | local_c0 >> 7)) +
            (uVar14 >> 10 ^ (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11))
    ;
    iVar8 = uVar24 + uVar9 + rhash_k256[lVar11 + 0x13] + ((uVar16 ^ uVar20) & uVar10 ^ uVar20) +
            ((uVar10 * 0x80 | uVar10 >> 0x19) ^
            (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
    uVar17 = uVar17 + iVar8;
    uVar23 = ((uVar12 ^ uVar15) & uVar13 ^ uVar12 & uVar15) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar8;
    local_c0 = local_c0 + local_108 +
               (local_cc >> 3 ^
               (local_cc << 0xe | local_cc >> 0x12) ^ (local_cc << 0x19 | local_cc >> 7)) +
               (uVar19 >> 10 ^
               (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11));
    iVar8 = uVar20 + local_c0 + rhash_k256[lVar11 + 0x14] + ((uVar10 ^ uVar16) & uVar17 ^ uVar16) +
            ((uVar17 * 0x80 | uVar17 >> 0x19) ^
            (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    uVar13 = uVar13 + iVar8;
    uVar20 = ((uVar23 ^ uVar12) & uVar15 ^ uVar23 & uVar12) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
    local_cc = local_cc + uVar7 +
               (local_dc >> 3 ^
               (local_dc << 0xe | local_dc >> 0x12) ^ (local_dc << 0x19 | local_dc >> 7)) +
               (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
    iVar8 = rhash_k256[lVar11 + 0x15] + local_cc + uVar16 + ((uVar17 ^ uVar10) & uVar13 ^ uVar10) +
            ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
    local_dc = local_dc + local_fc +
               (local_d4 >> 3 ^
               (local_d4 << 0xe | local_d4 >> 0x12) ^ (local_d4 << 0x19 | local_d4 >> 7)) +
               (local_c0 >> 10 ^
               (local_c0 * 0x2000 | local_c0 >> 0x13) ^ (local_c0 * 0x8000 | local_c0 >> 0x11));
    uVar15 = uVar15 + iVar8;
    uVar16 = ((uVar20 ^ uVar23) & uVar12 ^ uVar20 & uVar23) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x16] + local_dc + uVar10 + ((uVar13 ^ uVar17) & uVar15 ^ uVar17) +
            ((uVar15 * 0x80 | uVar15 >> 0x19) ^
            (uVar15 * 0x200000 | uVar15 >> 0xb) ^ (uVar15 * 0x4000000 | uVar15 >> 6));
    local_d4 = (local_d0 >> 3 ^
               (local_d0 << 0xe | local_d0 >> 0x12) ^ (local_d0 << 0x19 | local_d0 >> 7)) + local_d4
               + uVar21 +
               (local_cc >> 10 ^
               (local_cc * 0x2000 | local_cc >> 0x13) ^ (local_cc * 0x8000 | local_cc >> 0x11));
    uVar12 = uVar12 + iVar8;
    uVar10 = ((uVar16 ^ uVar20) & uVar23 ^ uVar16 & uVar20) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x17] + local_d4 + uVar17 + ((uVar15 ^ uVar13) & uVar12 ^ uVar13) +
            ((uVar12 * 0x80 | uVar12 >> 0x19) ^
            (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6));
    local_d0 = (uVar18 >> 3 ^ (uVar18 << 0xe | uVar18 >> 0x12) ^ (uVar18 << 0x19 | uVar18 >> 7)) +
               local_d0 + uVar14 +
               (local_dc >> 10 ^
               (local_dc * 0x2000 | local_dc >> 0x13) ^ (local_dc * 0x8000 | local_dc >> 0x11));
    uVar23 = uVar23 + iVar8;
    uVar17 = ((uVar10 ^ uVar16) & uVar20 ^ uVar10 & uVar16) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x18] + local_d0 + uVar13 + ((uVar12 ^ uVar15) & uVar23 ^ uVar15) +
            ((uVar23 * 0x80 | uVar23 >> 0x19) ^
            (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar18 = (local_e0 >> 3 ^
             (local_e0 << 0xe | local_e0 >> 0x12) ^ (local_e0 << 0x19 | local_e0 >> 7)) + uVar18 +
             uVar19 + (local_d4 >> 10 ^
                      (local_d4 * 0x2000 | local_d4 >> 0x13) ^
                      (local_d4 * 0x8000 | local_d4 >> 0x11));
    uVar20 = uVar20 + iVar8;
    uVar22 = ((uVar17 ^ uVar10) & uVar16 ^ uVar17 & uVar10) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x19] + uVar18 + uVar15 + ((uVar23 ^ uVar12) & uVar20 ^ uVar12) +
            ((uVar20 * 0x80 | uVar20 >> 0x19) ^
            (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    local_e0 = (local_c8 >> 3 ^
               (local_c8 << 0xe | local_c8 >> 0x12) ^ (local_c8 << 0x19 | local_c8 >> 7)) + local_e0
               + uVar9 + (local_d0 >> 10 ^
                         (local_d0 * 0x2000 | local_d0 >> 0x13) ^
                         (local_d0 * 0x8000 | local_d0 >> 0x11));
    uVar16 = uVar16 + iVar8;
    uVar25 = ((uVar22 ^ uVar17) & uVar10 ^ uVar22 & uVar17) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x1a] + local_e0 + uVar12 + ((uVar20 ^ uVar23) & uVar16 ^ uVar23) +
            ((uVar16 * 0x80 | uVar16 >> 0x19) ^
            (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6));
    local_c8 = (local_104 >> 3 ^
               (local_104 << 0xe | local_104 >> 0x12) ^ (local_104 << 0x19 | local_104 >> 7)) +
               local_c8 + local_c0 +
               (uVar18 >> 10 ^
               (uVar18 * 0x2000 | uVar18 >> 0x13) ^ (uVar18 * 0x8000 | uVar18 >> 0x11));
    uVar10 = uVar10 + iVar8;
    uVar12 = ((uVar25 ^ uVar22) & uVar17 ^ uVar25 & uVar22) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x1b] + local_c8 + uVar23 + ((uVar16 ^ uVar20) & uVar10 ^ uVar20) +
            ((uVar10 * 0x80 | uVar10 >> 0x19) ^
            (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
    local_104 = (local_108 >> 3 ^
                (local_108 << 0xe | local_108 >> 0x12) ^ (local_108 << 0x19 | local_108 >> 7)) +
                local_104 + local_cc +
                (local_e0 >> 10 ^
                (local_e0 * 0x2000 | local_e0 >> 0x13) ^ (local_e0 * 0x8000 | local_e0 >> 0x11));
    uVar17 = uVar17 + iVar8;
    uVar24 = ((uVar12 ^ uVar25) & uVar22 ^ uVar12 & uVar25) +
             ((uVar12 * 0x400 | uVar12 >> 0x16) ^
             (uVar12 * 0x80000 | uVar12 >> 0xd) ^ (uVar12 * 0x40000000 | uVar12 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x1c] + local_104 + uVar20 + ((uVar10 ^ uVar16) & uVar17 ^ uVar16) +
            ((uVar17 * 0x80 | uVar17 >> 0x19) ^
            (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    local_108 = (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) +
                local_108 + local_dc +
                (local_c8 >> 10 ^
                (local_c8 * 0x2000 | local_c8 >> 0x13) ^ (local_c8 * 0x8000 | local_c8 >> 0x11));
    uVar22 = uVar22 + iVar8;
    uVar20 = ((uVar24 ^ uVar12) & uVar25 ^ uVar24 & uVar12) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x1d] + local_108 + uVar16 + ((uVar17 ^ uVar10) & uVar22 ^ uVar10) +
            ((uVar22 * 0x80 | uVar22 >> 0x19) ^
            (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
    uVar7 = (local_fc >> 3 ^
            (local_fc << 0xe | local_fc >> 0x12) ^ (local_fc << 0x19 | local_fc >> 7)) + uVar7 +
            local_d4 +
            (local_104 >> 10 ^
            (local_104 * 0x2000 | local_104 >> 0x13) ^ (local_104 * 0x8000 | local_104 >> 0x11));
    uVar25 = uVar25 + iVar8;
    uVar16 = ((uVar20 ^ uVar24) & uVar12 ^ uVar20 & uVar24) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x1e] + uVar7 + uVar10 + ((uVar22 ^ uVar17) & uVar25 ^ uVar17) +
            ((uVar25 * 0x80 | uVar25 >> 0x19) ^
            (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6));
    local_fc = (uVar21 >> 3 ^
               (uVar21 * 0x4000 | uVar21 >> 0x12) ^ (uVar21 * 0x2000000 | uVar21 >> 7)) + local_fc +
               local_d0 +
               (local_108 >> 10 ^
               (local_108 * 0x2000 | local_108 >> 0x13) ^ (local_108 * 0x8000 | local_108 >> 0x11));
    uVar12 = uVar12 + iVar8;
    uVar10 = ((uVar16 ^ uVar20) & uVar24 ^ uVar16 & uVar20) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar8;
    iVar8 = rhash_k256[lVar11 + 0x1f] + local_fc + uVar17 + ((uVar25 ^ uVar22) & uVar12 ^ uVar22) +
            ((uVar12 * 0x80 | uVar12 >> 0x19) ^
            (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6));
    uVar24 = uVar24 + iVar8;
    uVar17 = ((uVar10 ^ uVar16) & uVar20 ^ uVar10 & uVar16) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    lVar11 = lVar11 + 0x10;
  } while ((uint)lVar11 < 0x30);
  *hash = uVar17 + uVar1;
  hash[1] = uVar10 + uVar2;
  hash[2] = uVar16 + uVar3;
  hash[3] = uVar20 + hash[3];
  hash[4] = uVar24 + uVar4;
  hash[5] = uVar12 + uVar5;
  hash[6] = uVar25 + uVar6;
  hash[7] = uVar22 + hash[7];
  return;
}

Assistant:

static void rhash_sha256_process_block(unsigned hash[8], unsigned block[16])
{
	unsigned A, B, C, D, E, F, G, H;
	unsigned W[16];
	const unsigned* k;
	int i;

	A = hash[0], B = hash[1], C = hash[2], D = hash[3];
	E = hash[4], F = hash[5], G = hash[6], H = hash[7];

	/* Compute SHA using alternate Method: FIPS 180-3 6.1.3 */
	ROUND_1_16(A, B, C, D, E, F, G, H, 0);
	ROUND_1_16(H, A, B, C, D, E, F, G, 1);
	ROUND_1_16(G, H, A, B, C, D, E, F, 2);
	ROUND_1_16(F, G, H, A, B, C, D, E, 3);
	ROUND_1_16(E, F, G, H, A, B, C, D, 4);
	ROUND_1_16(D, E, F, G, H, A, B, C, 5);
	ROUND_1_16(C, D, E, F, G, H, A, B, 6);
	ROUND_1_16(B, C, D, E, F, G, H, A, 7);
	ROUND_1_16(A, B, C, D, E, F, G, H, 8);
	ROUND_1_16(H, A, B, C, D, E, F, G, 9);
	ROUND_1_16(G, H, A, B, C, D, E, F, 10);
	ROUND_1_16(F, G, H, A, B, C, D, E, 11);
	ROUND_1_16(E, F, G, H, A, B, C, D, 12);
	ROUND_1_16(D, E, F, G, H, A, B, C, 13);
	ROUND_1_16(C, D, E, F, G, H, A, B, 14);
	ROUND_1_16(B, C, D, E, F, G, H, A, 15);

	for (i = 16, k = &rhash_k256[16]; i < 64; i += 16, k += 16) {
		ROUND_17_64(A, B, C, D, E, F, G, H,  0);
		ROUND_17_64(H, A, B, C, D, E, F, G,  1);
		ROUND_17_64(G, H, A, B, C, D, E, F,  2);
		ROUND_17_64(F, G, H, A, B, C, D, E,  3);
		ROUND_17_64(E, F, G, H, A, B, C, D,  4);
		ROUND_17_64(D, E, F, G, H, A, B, C,  5);
		ROUND_17_64(C, D, E, F, G, H, A, B,  6);
		ROUND_17_64(B, C, D, E, F, G, H, A,  7);
		ROUND_17_64(A, B, C, D, E, F, G, H,  8);
		ROUND_17_64(H, A, B, C, D, E, F, G,  9);
		ROUND_17_64(G, H, A, B, C, D, E, F, 10);
		ROUND_17_64(F, G, H, A, B, C, D, E, 11);
		ROUND_17_64(E, F, G, H, A, B, C, D, 12);
		ROUND_17_64(D, E, F, G, H, A, B, C, 13);
		ROUND_17_64(C, D, E, F, G, H, A, B, 14);
		ROUND_17_64(B, C, D, E, F, G, H, A, 15);
	}

	hash[0] += A, hash[1] += B, hash[2] += C, hash[3] += D;
	hash[4] += E, hash[5] += F, hash[6] += G, hash[7] += H;
}